

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int mapViableBiome(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar2 = mapBiome(l,out,x,z,w,h);
  if (iVar2 == 0) {
    iVar1 = *l->data;
    uVar4 = 0;
    uVar7 = 0;
    if (0 < w) {
      uVar7 = (ulong)(uint)w;
    }
    uVar5 = (ulong)(uint)h;
    if (h < 1) {
      uVar5 = uVar4;
    }
    iVar2 = 0;
    for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        if (0xf < iVar1 - 1U) {
          return 0;
        }
        iVar3 = out[uVar6];
        switch(iVar1) {
        case 1:
        case 0x10:
          if (iVar3 == 2) {
            return 0;
          }
          iVar3 = isMesa(iVar3);
          goto LAB_0010a603;
        case 2:
          if (iVar3 == 0x15) {
            return 0;
          }
          break;
        case 3:
          if (iVar3 == 6) {
            return 0;
          }
          break;
        case 4:
          if (iVar3 == 0xc) {
            return 0;
          }
          if (iVar3 == 0x1e) {
            return 0;
          }
          break;
        default:
          goto switchD_0010a5f0_caseD_5;
        case 6:
        case 7:
        case 8:
        case 0xe:
          iVar3 = isOceanic(iVar3);
LAB_0010a603:
          if (iVar3 != 0) {
            return 0;
          }
          break;
        case 9:
          if (iVar3 == 0x1d) {
            return 0;
          }
        }
      }
      out = out + w;
    }
    iVar2 = 1;
  }
switchD_0010a5f0_caseD_5:
  return iVar2;
}

Assistant:

static int mapViableBiome(const Layer * l, int * out, int x, int z, int w, int h)
{
    int err = mapBiome(l, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    int styp = ((const int*) l->data)[0];
    int i, j;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int biomeID = out[i + w*j];
            switch (styp)
            {
            case Desert_Pyramid:
            case Desert_Well:
                if (biomeID == desert || isMesa(biomeID))
                    return 0;
                break;
            case Jungle_Pyramid:
                if (biomeID == jungle)
                    return 0;
                break;
            case Swamp_Hut:
                if (biomeID == swamp)
                    return 0;
                break;
            case Igloo:
                if (biomeID == snowy_tundra || biomeID == snowy_taiga)
                    return 0;
                break;
            case Treasure:
                if (isOceanic(biomeID))
                    return 0;
                break;
            case Ocean_Ruin:
            case Shipwreck:
            case Monument:
                if (isOceanic(biomeID))
                    return 0;
                break;
            case Mansion:
                if (biomeID == dark_forest)
                    return 0;
                break;
            default:
                return 0;
            }
        }
    }

    return 1; // required biomes not found: set err status to stop generator
}